

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

int fmt::v7::detail::format_float<long_double>
              (longdouble value,int precision,float_specs specs,buffer<char> *buf)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  char cVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  type tVar14;
  result rVar15;
  ulong uVar16;
  byte bVar17;
  long lVar18;
  ulong uVar19;
  uint64_t uVar20;
  uint uVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  uint64_t uVar25;
  boundaries bVar26;
  fp fVar27;
  fp fVar28;
  ulong uStackY_b0;
  undefined1 local_70 [8];
  fixed_handler handler;
  uint local_38;
  uint local_34;
  int cached_exp10;
  int exp;
  
  if (value < (longdouble)0) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/format-inl.h"
                ,0x435,"value is negative");
  }
  uVar23 = (ulong)specs & 0xff00000000;
  if (value <= (longdouble)0) {
    if (0 < precision && uVar23 == 0x200000000) {
      tVar14 = to_unsigned<int>(precision);
      buffer<char>::try_resize(buf,(ulong)tVar14);
      memset(buf->ptr_,0x30,(ulong)(uint)precision);
      return -precision;
    }
    local_70[0] = 0x30;
    buffer<char>::push_back(buf,local_70);
    return 0;
  }
  if ((specs._4_4_ >> 0x13 & 1) == 0) {
    iVar13 = snprintf_float<long_double>(value,precision,specs,buf);
    return iVar13;
  }
  local_34 = 0;
  local_38 = 0;
  if (precision < 0) {
    handler.exp10 = 0;
    handler.fixed = false;
    handler._21_3_ = 0;
    if ((specs._4_4_ >> 0x12 & 1) == 0) {
      bVar26 = fp::assign_with_boundaries<long_double>((fp *)&handler.exp10,value);
    }
    else {
      bVar26 = fp::assign_float_with_boundaries<long_double>((fp *)&handler.exp10,value);
    }
    auVar12._8_8_ = 0;
    auVar12._0_8_ = bVar26.upper;
    fVar27 = normalize<0>((detail *)handler._16_8_,(fp)(auVar12 << 0x40));
    handler._16_8_ = fVar27.f;
    fVar28 = get_cached_power(-0x7c - fVar27.e,(int *)&local_38);
    uVar23 = fVar28.f;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar23;
    auVar7._8_8_ = 0;
    auVar7._0_4_ = handler.exp10;
    auVar7[4] = handler.fixed;
    auVar7._5_3_ = handler._21_3_;
    handler._16_8_ = SUB168(auVar3 * auVar7,8) - (SUB168(auVar3 * auVar7,0) >> 0x3f);
    if (0x1c < fVar28.e + fVar27.e + 0x7cU) {
      __assert_fail("min_exp <= fp_value.e && fp_value.e <= -32",
                    "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/format-inl.h"
                    ,0x455,
                    "int fmt::detail::format_float(T, int, float_specs, buffer<char> &) [T = long double]"
                   );
    }
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar23;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = bVar26.upper;
    lVar18 = SUB168(auVar4 * auVar8,8);
    lVar22 = -(SUB168(auVar4 * auVar8,0) >> 0x3f);
    uVar24 = lVar18 + lVar22 + 1;
    bVar17 = -((char)fVar28.e + (char)fVar27.e + '@');
    uVar25 = 1L << (bVar17 & 0x3f);
    uVar19 = uVar24 >> (bVar17 & 0x3f);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar23;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = bVar26.lower;
    local_70 = (undefined1  [8])buf->ptr_;
    handler._8_8_ = uVar24 - handler._16_8_;
    handler.buf._0_4_ = 0;
    if ((uint32_t)uVar19 == 0) {
LAB_00225678:
      handler.buf._0_4_ = 0;
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/format-inl.h"
                  ,0x334,"");
    }
    uVar20 = ((SUB168(auVar5 * auVar9,0) >> 0x3f) - SUB168(auVar5 * auVar9,8)) + lVar18 + lVar22 + 2
    ;
    uVar23 = uVar25 - 1;
    uVar24 = uVar24 & uVar23;
    local_34 = grisu_count_digits((uint32_t)uVar19);
    do {
      uVar21 = local_34 - 1;
      switch((ulong)uVar21) {
      case 0:
        cVar10 = (char)uVar19;
        uVar19 = 0;
        goto LAB_00225511;
      case 1:
        uStackY_b0 = 10;
        break;
      case 2:
        uStackY_b0 = 100;
        break;
      case 3:
        uStackY_b0 = 1000;
        break;
      case 4:
        uStackY_b0 = 10000;
        break;
      case 5:
        uStackY_b0 = 100000;
        break;
      case 6:
        uStackY_b0 = 1000000;
        break;
      case 7:
        uStackY_b0 = 10000000;
        break;
      case 8:
        uStackY_b0 = 100000000;
        break;
      case 9:
        uStackY_b0 = 1000000000;
        break;
      default:
        goto switchD_00225265_default;
      }
      cVar10 = (char)((uVar19 & 0xffffffff) / uStackY_b0);
      uVar19 = (uVar19 & 0xffffffff) % uStackY_b0;
LAB_00225511:
      local_34 = uVar21;
      rVar15 = grisu_shortest_handler::on_digit
                         ((grisu_shortest_handler *)local_70,cVar10 + '0',
                          *(long *)(basic_data<void>::powers_of_10_64 + (ulong)uVar21 * 8) <<
                          (bVar17 & 0x3f),(uVar19 << (bVar17 & 0x3f)) + uVar24,uVar20,uVar21,true);
      if (rVar15 != more) goto LAB_002255a4;
    } while (0 < (int)local_34);
    do {
      uVar19 = uVar24 * 10;
      uVar20 = uVar20 * 10;
      uVar24 = uVar19 & uVar23;
      local_34 = local_34 - 1;
      rVar15 = grisu_shortest_handler::on_digit
                         ((grisu_shortest_handler *)local_70,(char)(uVar19 >> (bVar17 & 0x3f)) + '0'
                          ,uVar25,uVar24,uVar20,local_34,false);
    } while (rVar15 == more);
LAB_002255a4:
    if (rVar15 == error) {
      local_34 = local_34 + (uint)handler.buf + ~local_38;
      fallback_format<long_double>(value,buf,(int *)&local_34);
      return local_34;
    }
    uVar21 = to_unsigned<int>((uint)handler.buf);
LAB_00225625:
    buffer<char>::try_resize(buf,(ulong)uVar21);
    iVar13 = local_34 - local_38;
  }
  else {
    if ((uint)precision < 0x12) {
      auVar11._8_8_ = 0;
      auVar11._0_8_ = buf;
      fVar27 = normalize<0>((detail *)0x0,(fp)(auVar11 << 0x40));
      fVar28 = get_cached_power(-0x7c - fVar27.e,(int *)&local_38);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = fVar28.f;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = fVar27.f;
      uVar24 = SUB168(auVar2 * auVar6,8) - (SUB168(auVar2 * auVar6,0) >> 0x3f);
      cVar10 = (char)fVar28.e + (char)fVar27.e;
      local_70 = (undefined1  [8])buf->ptr_;
      handler.buf._0_4_ = 0;
      bVar17 = -cVar10;
      uVar25 = 1L << (bVar17 & 0x3f);
      handler.precision._0_1_ = uVar23 == 0x200000000;
      handler.size = -local_38;
      uVar19 = uVar24 >> (bVar17 & 0x3f);
      handler.buf._4_4_ = precision;
      if ((uint32_t)uVar19 == 0) goto LAB_00225678;
      if (uVar19 >> 0x20 != 0) {
        assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/format-inl.h"
                    ,0x335,"");
      }
      bVar17 = -cVar10 - 0x40;
      local_34 = grisu_count_digits((uint32_t)uVar19);
      rVar15 = fixed_handler::on_start
                         ((fixed_handler *)local_70,
                          *(long *)(basic_data<void>::bsr2log10 + (long)(int)local_34 * 8 + 0x78) <<
                          (bVar17 & 0x3f),uVar24 / 10,10,(int *)&local_34);
      if (rVar15 == more) {
        uVar16 = uVar25 - 1;
        uVar24 = uVar24 & uVar16;
        uVar20 = 1;
        do {
          uVar21 = local_34 - 1;
          switch((ulong)uVar21) {
          case 0:
            cVar10 = (char)uVar19;
            uVar19 = 0;
            goto LAB_002252cd;
          case 1:
            uStackY_b0 = 10;
            break;
          case 2:
            uStackY_b0 = 100;
            break;
          case 3:
            uStackY_b0 = 1000;
            break;
          case 4:
            uStackY_b0 = 10000;
            break;
          case 5:
            uStackY_b0 = 100000;
            break;
          case 6:
            uStackY_b0 = 1000000;
            break;
          case 7:
            uStackY_b0 = 10000000;
            break;
          case 8:
            uStackY_b0 = 100000000;
            break;
          case 9:
            uStackY_b0 = 1000000000;
            break;
          default:
switchD_00225265_default:
            assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/format-inl.h"
                        ,0x367,"invalid number of digits");
          }
          cVar10 = (char)((uVar19 & 0xffffffff) / uStackY_b0);
          uVar19 = (uVar19 & 0xffffffff) % uStackY_b0;
LAB_002252cd:
          local_34 = uVar21;
          rVar15 = fixed_handler::on_digit
                             ((fixed_handler *)local_70,cVar10 + '0',
                              *(long *)(basic_data<void>::powers_of_10_64 + (ulong)uVar21 * 8) <<
                              (bVar17 & 0x3f),(uVar19 << (bVar17 & 0x3f)) + uVar24,1,uVar21,true);
          if (rVar15 != more) goto LAB_0022535a;
        } while (0 < (int)local_34);
        do {
          uVar19 = uVar24 * 10;
          uVar20 = uVar20 * 10;
          uVar24 = uVar19 & uVar16;
          local_34 = local_34 - 1;
          rVar15 = fixed_handler::on_digit
                             ((fixed_handler *)local_70,(char)(uVar19 >> (bVar17 & 0x3f)) + '0',
                              uVar25,uVar24,uVar20,local_34,false);
        } while (rVar15 == more);
      }
LAB_0022535a:
      if (rVar15 != error) {
        uVar19 = (ulong)(uint)handler.buf;
        if (0 < (int)(uint)handler.buf && uVar23 != 0x200000000) {
          uVar19 = (ulong)(uint)handler.buf;
          do {
            uVar21 = local_34 + 1;
            if (buf->ptr_[uVar19 - 1] != '0') goto LAB_0022561b;
            bVar1 = 1 < uVar19;
            uVar19 = uVar19 - 1;
            local_34 = uVar21;
          } while (bVar1);
          uVar19 = 0;
        }
LAB_0022561b:
        uVar21 = to_unsigned<int>((int)uVar19);
        goto LAB_00225625;
      }
    }
    iVar13 = snprintf_float<long_double>(value,precision,specs,buf);
  }
  return iVar13;
}

Assistant:

int format_float(T value, int precision, float_specs specs, buffer<char>& buf) {
  static_assert(!std::is_same<T, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.try_resize(to_unsigned(precision));
    std::uninitialized_fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (!specs.use_grisu) return snprintf_float(value, precision, specs, buf);

  int exp = 0;
  const int min_exp = -60;  // alpha in Grisu.
  int cached_exp10 = 0;     // K in Grisu.
  if (precision < 0) {
    fp fp_value;
    auto boundaries = specs.binary32
                          ? fp_value.assign_float_with_boundaries(value)
                          : fp_value.assign_with_boundaries(value);
    fp_value = normalize(fp_value);
    // Find a cached power of 10 such that multiplying value by it will bring
    // the exponent in the range [min_exp, -32].
    const fp cached_pow = get_cached_power(
        min_exp - (fp_value.e + fp::significand_size), cached_exp10);
    // Multiply value and boundaries by the cached power of 10.
    fp_value = fp_value * cached_pow;
    boundaries.lower = multiply(boundaries.lower, cached_pow.f);
    boundaries.upper = multiply(boundaries.upper, cached_pow.f);
    assert(min_exp <= fp_value.e && fp_value.e <= -32);
    --boundaries.lower;  // \tilde{M}^- - 1 ulp -> M^-_{\downarrow}.
    ++boundaries.upper;  // \tilde{M}^+ + 1 ulp -> M^+_{\uparrow}.
    // Numbers outside of (lower, upper) definitely do not round to value.
    grisu_shortest_handler handler{buf.data(), 0,
                                   boundaries.upper - fp_value.f};
    auto result =
        grisu_gen_digits(fp(boundaries.upper, fp_value.e),
                         boundaries.upper - boundaries.lower, exp, handler);
    if (result == digits::error) {
      exp += handler.size - cached_exp10 - 1;
      fallback_format(value, buf, exp);
      return exp;
    }
    buf.try_resize(to_unsigned(handler.size));
  } else {
    if (precision > 17) return snprintf_float(value, precision, specs, buf);
    fp normalized = normalize(fp(value));
    const auto cached_pow = get_cached_power(
        min_exp - (normalized.e + fp::significand_size), cached_exp10);
    normalized = normalized * cached_pow;
    fixed_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
    if (grisu_gen_digits(normalized, 1, exp, handler) == digits::error)
      return snprintf_float(value, precision, specs, buf);
    int num_digits = handler.size;
    if (!fixed) {
      // Remove trailing zeros.
      while (num_digits > 0 && buf[num_digits - 1] == '0') {
        --num_digits;
        ++exp;
      }
    }
    buf.try_resize(to_unsigned(num_digits));
  }
  return exp - cached_exp10;
}